

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolodetectionoutput.cpp
# Opt level: O0

Layer * ncnn::YoloDetectionOutput_layer_creator(void)

{
  Layer *pLVar1;
  YoloDetectionOutput *in_stack_00000520;
  
  pLVar1 = (Layer *)operator_new(0xd0);
  YoloDetectionOutput::YoloDetectionOutput(in_stack_00000520);
  return pLVar1;
}

Assistant:

YoloDetectionOutput::YoloDetectionOutput()
{
    one_blob_only = true;
    support_inplace = true;

    softmax = ncnn::create_layer(ncnn::LayerType::Softmax);

    // set param
    ncnn::ParamDict pd;
    pd.set(0, 0);// axis

    softmax->load_param(pd);
}